

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satform.cpp
# Opt level: O0

void standard_form(expression *a)

{
  expression *a_local;
  
  reduce_associative(a);
  mathCore::recursive_standardize(a);
  mathCore::combine_and(a);
  mathCore::combine_or(a);
  mathCore::recursive_idempotent(a);
  return;
}

Assistant:

void standard_form(expression* a) {
	reduce_associative(a);
	mathCore::recursive_standardize(a);
	// Now you should be able to do this well
	mathCore::combine_and(a);
	mathCore::combine_or(a);
	mathCore::recursive_idempotent(a);
}